

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O1

char * __thiscall cppcms::impl::string_map::get(string_map *this,char *ckey)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  byte *pbVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  char *__s1;
  ulong uVar9;
  long *plVar10;
  bool bVar11;
  
  bVar6 = *ckey;
  if (bVar6 == 0) {
    uVar8 = 0;
  }
  else {
    pbVar5 = (byte *)(ckey + 1);
    uVar8 = 0;
    do {
      uVar8 = (uint)bVar6 + uVar8 * 0x10;
      uVar8 = uVar8 & 0xfffffff ^ uVar8 >> 0x18 & 0xfffffff0;
      bVar6 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar6 != 0);
  }
  lVar1 = *(long *)(this + 0x10);
  uVar9 = (*(long *)(this + 0x18) - lVar1 >> 3) * -0x5555555555555555;
  uVar7 = (ulong)uVar8 % uVar9;
  __s1 = *(char **)(lVar1 + uVar7 * 0x18);
  bVar11 = __s1 == (char *)0x0;
  if (!bVar11) {
    plVar10 = (long *)(uVar7 * 0x18 + lVar1);
    do {
      if ((*(uint *)(plVar10 + 2) == uVar8) && (iVar4 = strcmp(__s1,ckey), iVar4 == 0)) {
        if (bVar11) {
          return (char *)0x0;
        }
        return (char *)plVar10[1];
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar9;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)((uVar7 << 0x20) + 0x100000000) >> 0x20;
      uVar7 = SUB168(auVar3 % auVar2,0);
      plVar10 = (long *)((long)SUB164(auVar3 % auVar2,0) * 0x18 + lVar1);
      __s1 = (char *)*plVar10;
      bVar11 = __s1 == (char *)0x0;
    } while (!bVar11);
  }
  return (char *)0x0;
}

Assistant:

char const *get(char const *ckey)
			{
				entry e(ckey);
				int pos = e.hash % data_.size();
				while(data_[pos].key && !(data_[pos] == e)) 
					pos = (pos + 1) % data_.size();
				if(data_[pos].key == 0)
					return 0;
				return data_[pos].value;
			}